

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O0

void getDWPTCoeffs(wpt_object wt,int X,int Y,double *coeffs,int N)

{
  bool bVar1;
  int local_34;
  int flag;
  int citer;
  int np;
  int i;
  int ymax;
  int N_local;
  double *coeffs_local;
  int Y_local;
  int X_local;
  wpt_object wt_local;
  
  if ((X < 1) || (wt->J < X)) {
    printf("X co-ordinate must be >= 1 and <= %d",(ulong)(uint)wt->J);
    exit(-1);
  }
  np = 1;
  for (citer = 0; citer < X; citer = citer + 1) {
    np = np << 1;
  }
  if ((Y < 0) || ((int)(np - 1U) < Y)) {
    printf("Y co-ordinate must be >= 0 and <= %d",(ulong)(np - 1U));
    exit(-1);
  }
  flag = 0;
  local_34 = 0;
  for (citer = wt->J; X < citer; citer = citer + -1) {
    flag = wt->numnodeslevel[citer] + flag;
    local_34 = wt->numnodeslevel[citer] * wt->coeflength[citer] + local_34;
  }
  bVar1 = false;
  citer = 0;
  do {
    if (wt->numnodeslevel[X] <= citer) {
LAB_00106e63:
      if (!bVar1) {
        printf(
              "The Node is Not Part Of The Best Basis Tree Use wpt_summary function to list available nodes \n"
              );
        exit(-1);
      }
      for (citer = 0; citer < N; citer = citer + 1) {
        coeffs[citer] = wt->output[local_34 + citer];
      }
      return;
    }
    if (wt->nodeindex[flag * 2 + 1] == Y) {
      bVar1 = true;
      goto LAB_00106e63;
    }
    flag = flag + 1;
    local_34 = wt->coeflength[X] + local_34;
    citer = citer + 1;
  } while( true );
}

Assistant:

void getDWPTCoeffs(wpt_object wt, int X, int Y, double *coeffs, int N) {
	int ymax, i;
	int np,citer;
	int flag;

	if (X <= 0 || X > wt->J) {
		printf("X co-ordinate must be >= 1 and <= %d", wt->J);
		exit(-1);
	}
	ymax = 1;
	for (i = 0; i < X; ++i) {
		ymax *= 2;
	}

	ymax -= 1;

	if (Y < 0 || Y > ymax) {
		printf("Y co-ordinate must be >= 0 and <= %d", ymax);
		exit(-1);
	}

	np = 0;
	citer = 0;

	for (i = wt->J; i > X; --i) {
		np += wt->numnodeslevel[i];
		citer += wt->numnodeslevel[i] * wt->coeflength[i];
	}

	i = 0;
	flag = 0;
	for (i = 0; i < wt->numnodeslevel[X]; ++i) {
		if (wt->nodeindex[2 * np + 1] == Y) {
			flag = 1;
			break;
		}
		np++;
		citer += wt->coeflength[X];
	}

	if (flag == 0) {
		printf("The Node is Not Part Of The Best Basis Tree Use wpt_summary function to list available nodes \n");
		exit(-1);
	}

	for (i = 0; i < N; ++i) {
		coeffs[i] = wt->output[citer + i];
	}

}